

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

WriteBarrierPtr<void> * __thiscall
Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
          (Memory *this,Recycler *allocator,AllocFuncType AllocFunc,size_t count)

{
  void *__s;
  WriteBarrierPtr<void> *pWVar1;
  
  if (count != 0) {
    __s = new__<Memory::Recycler>
                    (-(ulong)(count >> 0x3d != 0) | count << 3,(Recycler *)this,
                     (offset_in_Recycler_to_subr)allocator);
    pWVar1 = (WriteBarrierPtr<void> *)memset(__s,0,count << 3);
    return pWVar1;
  }
  Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
  return (WriteBarrierPtr<void> *)0x8;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}